

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atcp.c
# Opt level: O0

void nn_atcp_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_ep *self_00;
  uint in_EDX;
  uint in_ESI;
  nn_usock *in_RDI;
  size_t sz;
  int val;
  nn_atcp *atcp;
  nn_usock *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  void *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  nn_usock *in_stack_ffffffffffffffd0;
  long lVar1;
  
  if (in_RDI == (nn_usock *)0x0) {
    in_RDI = (nn_usock *)0x0;
  }
  self_00 = (nn_ep *)(ulong)(in_RDI->state - 1);
  switch(self_00) {
  case (nn_ep *)0x0:
    if (in_ESI != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)in_RDI->state,(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
              ,0xb2);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)in_RDI->state,0xfffffffe,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
              ,0xae);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_usock_accept(in_stack_ffffffffffffffd0,in_RDI);
    in_RDI->state = 2;
    break;
  case (nn_ep *)0x1:
    if (in_ESI == 1) {
      if (in_EDX != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)in_RDI->state,1,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
                ,0xe4);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_ep_clear_error((nn_ep *)0x180b1d);
      lVar1 = 4;
      nn_ep_getopt(self_00,in_ESI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                   (size_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (lVar1 != 4) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (val)",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
                ,0xc4);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_setsockopt((nn_usock *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),
                          (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                          (int)in_stack_ffffffffffffffb0,
                          (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      lVar1 = 4;
      nn_ep_getopt(self_00,in_ESI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                   (size_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (lVar1 != 4) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (val)",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
                ,0xc9);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_setsockopt((nn_usock *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),
                          (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                          (int)in_stack_ffffffffffffffb0,
                          (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      lVar1 = 4;
      nn_ep_getopt(self_00,in_ESI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                   (size_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (lVar1 != 4) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (val)",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
                ,0xce);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_setsockopt((nn_usock *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),
                          (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                          (int)in_stack_ffffffffffffffb0,
                          (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      nn_usock_swap_owner((nn_usock *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          (nn_fsm_owner *)in_stack_ffffffffffffff98);
      *(undefined8 *)&in_RDI[1].s = 0;
      in_RDI[1].wfd.src = -1;
      in_RDI[1].wfd.owner = (nn_fsm *)0x0;
      nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (nn_fsm_event *)in_stack_ffffffffffffff98,0);
      nn_usock_activate((nn_usock *)0x180d93);
      nn_stcp_start((nn_stcp *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff98);
      in_RDI->state = 3;
      nn_ep_stat_increment
                ((nn_ep *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
    }
    else {
      if (in_ESI != 3) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)(uint)in_RDI->state,(ulong)in_ESI,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
                ,0xf5);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_EDX != 6) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)(uint)in_RDI->state,3,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
                ,0xf1);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_usock_geterrno(*(nn_usock **)&in_RDI[1].s);
      nn_ep_set_error((nn_ep *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      nn_ep_stat_increment
                ((nn_ep *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
      nn_usock_accept(in_stack_ffffffffffffffd0,in_RDI);
    }
    break;
  case (nn_ep *)0x2:
    if (in_ESI != 2) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)in_RDI->state,(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
              ,0x10a);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 1) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)in_RDI->state,2,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
              ,0x106);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_stcp_stop((nn_stcp *)0x180f8b);
    in_RDI->state = 4;
    nn_ep_stat_increment
              ((nn_ep *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
    break;
  case (nn_ep *)0x3:
    if (in_ESI != 2) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)in_RDI->state,(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
              ,0x120);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX == 2) {
      nn_usock_stop((nn_usock *)0x1810ae);
      in_RDI->state = 5;
    }
    else if (in_EDX != 8) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)in_RDI->state,2,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
              ,0x11c);
      fflush(_stderr);
      nn_err_abort();
    }
    break;
  case (nn_ep *)0x4:
    if (in_ESI != 1) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)(uint)in_RDI->state,(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
              ,0x136);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX == 7) {
      nn_fsm_raise((nn_fsm *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (nn_fsm_event *)in_stack_ffffffffffffff98,0);
      in_RDI->state = 6;
    }
    else if (in_EDX != 8) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)(uint)in_RDI->state,1,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
              ,0x132);
      fflush(_stderr);
      nn_err_abort();
    }
    break;
  default:
    nn_backtrace_print();
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)(uint)in_RDI->state,(ulong)in_ESI,(ulong)in_EDX,
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/atcp.c"
            ,0x13d);
    fflush(_stderr);
    nn_err_abort();
  }
  return;
}

Assistant:

static void nn_atcp_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_atcp *atcp;
    int val;
    size_t sz;

    atcp = nn_cont (self, struct nn_atcp, fsm);

    switch (atcp->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The state machine wasn't yet started.                                     */
/******************************************************************************/
    case NN_ATCP_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_usock_accept (&atcp->usock, atcp->listener);
                atcp->state = NN_ATCP_STATE_ACCEPTING;
                return;
            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (atcp->state, src, type);
        }

/******************************************************************************/
/*  ACCEPTING state.                                                          */
/*  Waiting for incoming connection.                                          */
/******************************************************************************/
    case NN_ATCP_STATE_ACCEPTING:
        switch (src) {

        case NN_ATCP_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ACCEPTED:
                nn_ep_clear_error (atcp->ep);

                /*  Set the relevant socket options. */
                sz = sizeof (val);
                nn_ep_getopt (atcp->ep, NN_SOL_SOCKET, NN_SNDBUF, &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&atcp->usock, SOL_SOCKET, SO_SNDBUF,
                    &val, sizeof (val));
                sz = sizeof (val);
                nn_ep_getopt (atcp->ep, NN_SOL_SOCKET, NN_RCVBUF, &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&atcp->usock, SOL_SOCKET, SO_RCVBUF,
                    &val, sizeof (val));
                sz = sizeof (val);
                nn_ep_getopt (atcp->ep, NN_TCP, NN_TCP_NODELAY, &val, &sz);
                nn_assert (sz == sizeof (val));
                nn_usock_setsockopt (&atcp->usock, IPPROTO_TCP, TCP_NODELAY,
                    &val, sizeof (val));

                /*  Return ownership of the listening socket to the parent. */
                nn_usock_swap_owner (atcp->listener, &atcp->listener_owner);
                atcp->listener = NULL;
                atcp->listener_owner.src = -1;
                atcp->listener_owner.fsm = NULL;
                nn_fsm_raise (&atcp->fsm, &atcp->accepted, NN_ATCP_ACCEPTED);

                /*  Start the stcp state machine. */
                nn_usock_activate (&atcp->usock);
                nn_stcp_start (&atcp->stcp, &atcp->usock);
                atcp->state = NN_ATCP_STATE_ACTIVE;

                nn_ep_stat_increment (atcp->ep,
                    NN_STAT_ACCEPTED_CONNECTIONS, 1);

                return;

            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        case NN_ATCP_SRC_LISTENER:
            switch (type) {

            case NN_USOCK_ACCEPT_ERROR:
                nn_ep_set_error (atcp->ep, nn_usock_geterrno(atcp->listener));
                nn_ep_stat_increment (atcp->ep, NN_STAT_ACCEPT_ERRORS, 1);
                nn_usock_accept (&atcp->usock, atcp->listener);
                return;

            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (atcp->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_ATCP_STATE_ACTIVE:
        switch (src) {

        case NN_ATCP_SRC_STCP:
            switch (type) {
            case NN_STCP_ERROR:
                nn_stcp_stop (&atcp->stcp);
                atcp->state = NN_ATCP_STATE_STOPPING_STCP;
                nn_ep_stat_increment (atcp->ep, NN_STAT_BROKEN_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (atcp->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_STCP state.                                                      */
/******************************************************************************/
    case NN_ATCP_STATE_STOPPING_STCP:
        switch (src) {

        case NN_ATCP_SRC_STCP:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_STCP_STOPPED:
                nn_usock_stop (&atcp->usock);
                atcp->state = NN_ATCP_STATE_STOPPING_USOCK;
                return;
            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (atcp->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_USOCK state.                                                      */
/******************************************************************************/
    case NN_ATCP_STATE_STOPPING_USOCK:
        switch (src) {

        case NN_ATCP_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SHUTDOWN:
                return;
            case NN_USOCK_STOPPED:
                nn_fsm_raise (&atcp->fsm, &atcp->done, NN_ATCP_ERROR);
                atcp->state = NN_ATCP_STATE_DONE;
                return;
            default:
                nn_fsm_bad_action (atcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (atcp->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (atcp->state, src, type);
    }
}